

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManPatRareImprove(Gia_Man_t *p,int RareLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Flt_t *vQuo;
  Vec_Int_t *__ptr;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int level;
  long lVar7;
  uint uVar8;
  Vec_Wrd_t *pVVar9;
  float fVar10;
  double dVar11;
  timespec ts;
  uint local_7c;
  timespec local_78;
  int local_64;
  Vec_Wrd_t *local_60;
  uint local_54;
  float local_50;
  uint local_4c;
  long local_48;
  Gia_Man_t *local_40;
  Vec_Int_t *local_38;
  
  local_64 = fVerbose;
  iVar1 = clock_gettime(3,&local_78);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pVVar9 = p->vSimsPi;
  iVar1 = pVVar9->nSize / p->vCis->nSize;
  p->vSimsPi = (Vec_Wrd_t *)0x0;
  local_50 = Gia_ManPatGetTotalQuo(p,RareLimit,pVVar9,iVar1);
  uVar6 = iVar1 * 0x40;
  if (iVar1 < 1) {
    local_7c = 0;
    uVar8 = 0;
  }
  else {
    local_4c = 1;
    if (1 < (int)uVar6) {
      local_4c = uVar6;
    }
    uVar8 = 0;
    local_7c = 0;
    local_60 = pVVar9;
    local_54 = uVar6;
    local_48 = lVar5;
    local_40 = p;
    do {
      iVar2 = clock_gettime(3,&local_78);
      pVVar9 = local_60;
      lVar5 = 1;
      if (-1 < iVar2) {
        lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
        lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_78.tv_sec * -1000000;
      }
      pVVar3 = Gia_SimCollectRare(p,local_60,RareLimit);
      local_38 = Gia_ManPatCollectOne(p,pVVar9,uVar8,iVar1);
      vQuo = Gia_SimQualityImpact(p,local_38,pVVar3);
      __ptr = Gia_SimCollectBest(vQuo);
      if (local_64 != 0) {
        fVar10 = Gia_ManPatGetOneQuo(p,RareLimit,local_60,iVar1,uVar8);
        if (__ptr == (Vec_Int_t *)0x0) {
          dVar11 = 0.0;
          uVar4 = 0;
        }
        else {
          uVar4 = (ulong)(uint)__ptr->nSize;
          if (__ptr->nSize < 1) goto LAB_007da994;
          iVar2 = *__ptr->pArray;
          if (((long)iVar2 < 0) || (vQuo->nSize <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          dVar11 = (double)vQuo->pArray[iVar2];
        }
        printf("Pat %5d : Rare = %4d  Cands = %3d  Value = %8.3f  Change = %8.3f  ",(double)fVar10,
               dVar11,(ulong)uVar8,(ulong)(uint)(pVVar3->nSize / 2),uVar4);
        level = 3;
        iVar2 = clock_gettime(3,&local_78);
        if (iVar2 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + lVar5) / 1000000.0);
        p = local_40;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        iVar2 = rand();
        uVar4 = (long)iVar2 % (long)__ptr->nSize;
        if ((int)(__ptr->nSize | (uint)uVar4) < 0) {
LAB_007da994:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = __ptr->pArray[uVar4 & 0xffffffff] * iVar1;
        if (((int)uVar6 < 0) || (local_60->nSize <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        local_60->pArray[(ulong)uVar6 + (ulong)(uVar8 >> 6)] =
             local_60->pArray[(ulong)uVar6 + (ulong)(uVar8 >> 6)] ^ 1L << ((byte)uVar8 & 0x3f);
        local_7c = local_7c + 1;
      }
      iVar2 = pVVar3->nSize;
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
      }
      free(pVVar3);
      pVVar3 = local_38;
      if (local_38->pArray != (int *)0x0) {
        free(local_38->pArray);
      }
      free(pVVar3);
      if (vQuo->pArray != (float *)0x0) {
        free(vQuo->pArray);
      }
      free(vQuo);
      if (__ptr != (Vec_Int_t *)0x0) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
      }
      uVar8 = uVar8 + 1;
    } while (local_4c != uVar8);
    uVar8 = iVar2 / 2;
    lVar5 = local_48;
    pVVar9 = local_60;
    uVar6 = local_54;
  }
  if (local_64 != 0) {
    putchar(10);
  }
  fVar10 = Gia_ManPatGetTotalQuo(p,RareLimit,pVVar9,iVar1);
  p->vSimsPi = pVVar9;
  printf("Improved %d out of %d patterns using %d rare nodes: %.2f -> %.2f.  ",(double)local_50,
         (double)fVar10,(ulong)local_7c,(ulong)uVar6,(ulong)uVar8);
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_78);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  Abc_Print(iVar2,"%s =","Time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar7 + lVar5) / 1000000.0);
  return;
}

Assistant:

void Gia_ManPatRareImprove( Gia_Man_t * p, int RareLimit, int fVerbose )
{
    abctime clk = Abc_Clock();
    float FinalTotal, InitTotal;
    int n, nRares = 0, nChanges = 0, nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vPatterns = p->vSimsPi; p->vSimsPi = NULL;
    InitTotal = Gia_ManPatGetTotalQuo( p, RareLimit, vPatterns, nWords );
    for ( n = 0; n < 64*nWords; n++ )
    {
        abctime clk = Abc_Clock();
        Vec_Int_t * vRareCounts = Gia_SimCollectRare( p, vPatterns, RareLimit );
        Vec_Int_t * vPat        = Gia_ManPatCollectOne( p, vPatterns, n, nWords );
        Vec_Flt_t * vQuoIncs    = Gia_SimQualityImpact( p, vPat, vRareCounts );
        Vec_Int_t * vBest       = Gia_SimCollectBest( vQuoIncs );
        if ( fVerbose )
        {
            float PatQuo = Gia_ManPatGetOneQuo( p, RareLimit, vPatterns, nWords, n );
            printf( "Pat %5d : Rare = %4d  Cands = %3d  Value = %8.3f  Change = %8.3f  ", 
                n, Vec_IntSize(vRareCounts)/2, vBest ? Vec_IntSize(vBest) : 0, 
                PatQuo, vBest ? Vec_FltEntry(vQuoIncs, Vec_IntEntry(vBest,0)) : 0 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( vBest != NULL )
        {
            int VarBest = Vec_IntEntry( vBest, rand()%Vec_IntSize(vBest) );
            Abc_TtXorBit( Vec_WrdEntryP(vPatterns, VarBest*nWords), n );
            nChanges++;
        }
        nRares = Vec_IntSize(vRareCounts)/2;
        Vec_IntFree( vRareCounts );
        Vec_IntFree( vPat );
        Vec_FltFree( vQuoIncs );
        Vec_IntFreeP( &vBest );
    }
    if ( fVerbose )
        printf( "\n" );
    FinalTotal = Gia_ManPatGetTotalQuo( p, RareLimit, vPatterns, nWords );
    p->vSimsPi = vPatterns;

    printf( "Improved %d out of %d patterns using %d rare nodes: %.2f -> %.2f.  ", 
        nChanges, 64*nWords, nRares, InitTotal, FinalTotal );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}